

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_debug_line_header.cpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::debug_line_index::key(debug_line_index *this,string *s)

{
  bool bVar1;
  uint128 *puVar2;
  error_code eVar3;
  undefined1 local_48 [8];
  maybe<pstore::uint128,_void> digest;
  string *s_local;
  debug_line_index *this_local;
  error_category *local_10;
  
  digest.storage_._8_8_ = s;
  uint128::from_hex_string((maybe<pstore::uint128,_void> *)local_48,s);
  bVar1 = pstore::maybe::operator_cast_to_bool((maybe *)local_48);
  if (bVar1) {
    puVar2 = maybe<pstore::uint128,_void>::operator*((maybe<pstore::uint128,_void> *)local_48);
    *(long *)&(this->digest_).v_ = (long)puVar2->v_;
    *(undefined8 *)((long)&(this->digest_).v_ + 8) = *(undefined8 *)((long)&puVar2->v_ + 8);
    std::error_code::error_code((error_code *)&this_local);
  }
  maybe<pstore::uint128,_void>::~maybe((maybe<pstore::uint128,_void> *)local_48);
  if (!bVar1) {
    std::error_code::error_code<pstore::exchange::import_ns::error,void>
              ((error_code *)&this_local,bad_digest);
  }
  eVar3._4_4_ = 0;
  eVar3._M_value = (uint)this_local;
  eVar3._M_cat = local_10;
  return eVar3;
}

Assistant:

std::error_code debug_line_index::key (std::string const & s) {
                if (maybe<uint128> const digest = uint128::from_hex_string (s)) {
                    digest_ = *digest;
                    return {};
                }
                return error::bad_digest;
            }